

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::expression(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  nodekind nVar2;
  ostream *poVar3;
  undefined1 local_1b8 [96];
  Node local_158;
  Node local_118;
  allocator local_d1;
  string local_d0 [32];
  Node local_b0;
  undefined1 local_70 [8];
  Node varNode;
  Parser *this_local;
  Node *expNode;
  
  lVar1 = getLexemType(this);
  if (lVar1 == IDENTIFIER) {
    test(__return_storage_ptr__,this);
    nVar2 = Node::getKind(__return_storage_ptr__);
    if (nVar2 == FUNC_CALL) {
      nextLexem(this);
      lVar1 = getLexemType(this);
      if (lVar1 != CPAR) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\")\" expected");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      nextLexem(this);
    }
    lVar1 = getLexemType(this);
    if (lVar1 == EQUAL) {
      nVar2 = Node::getKind(__return_storage_ptr__);
      if ((nVar2 == UN_OP_EXPR_L_N) ||
         (nVar2 = Node::getKind(__return_storage_ptr__), nVar2 == UN_OP_EXPR_N)) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Error. Expression is not assignable");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      nVar2 = Node::getKind(__return_storage_ptr__);
      if (nVar2 == VAR) {
        nextLexem(this);
        Node::Node((Node *)local_70,__return_storage_ptr__);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"",&local_d1);
        Node::Node(&local_b0,SET,(string *)local_d0);
        Node::operator=(__return_storage_ptr__,&local_b0);
        Node::~Node(&local_b0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        Node::Node(&local_118,(Node *)local_70);
        Node::addSubnode(__return_storage_ptr__,&local_118);
        Node::~Node(&local_118);
        expression(&local_158,this);
        Node::addSubnode(__return_storage_ptr__,&local_158);
        Node::~Node(&local_158);
        Node::~Node((Node *)local_70);
      }
    }
    lVar1 = getLexemType(this);
    if (lVar1 == INTLITERAL) {
      getLexemValue_abi_cxx11_((Parser *)local_1b8);
      Node::Node((Node *)(local_1b8 + 0x20),CONST,(string *)local_1b8);
      Node::operator=(__return_storage_ptr__,(Node *)(local_1b8 + 0x20));
      Node::~Node((Node *)(local_1b8 + 0x20));
      std::__cxx11::string::~string((string *)local_1b8);
      nextLexem(this);
    }
  }
  else {
    test(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::expression() {
    if (getLexemType() != IDENTIFIER) {
        return test();
    }
    Node expNode = test();
    if (expNode.getKind() == FUNC_CALL) {
        nextLexem();
        if (getLexemType() != CPAR) {
            cout << "\")\" expected" << endl;
            exit(0);
        }
        nextLexem();
    }
    if (getLexemType() == EQUAL) {
        if (expNode.getKind() == UN_OP_EXPR_L_N || expNode.getKind() == UN_OP_EXPR_N) {
            cout << "Error. Expression is not assignable" << endl;
            exit(0);
        }
        if (expNode.getKind() == VAR) {
            nextLexem();
            Node varNode = Node(expNode);
            expNode = Node(SET);
            expNode.addSubnode(varNode);
            expNode.addSubnode(expression());
        }
    }
    if (getLexemType() == INTLITERAL) {
        expNode = Node(CONST, getLexemValue());
        nextLexem();
    }
    return expNode;
}